

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

EntryType * __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  Recycler *pRVar1;
  SimpleDictionaryEntry<unsigned_int,_Js::IndexPropertyDescriptor> *pSVar2;
  offset_in_Recycler_to_subr extraout_RDX;
  offset_in_Recycler_to_subr extraout_RDX_00;
  Recycler *local_70;
  offset_in_Recycler_to_subr local_68;
  TrackAllocData local_40;
  byte local_15;
  int local_14;
  bool zeroAllocate_local;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBStack_10;
  int size_local;
  BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  pRVar1 = this->alloc;
  local_15 = zeroAllocate;
  local_14 = size;
  pBStack_10 = this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,
             (type_info *)&SimpleDictionaryEntry<unsigned_int,Js::IndexPropertyDescriptor>::typeinfo
             ,0,(long)size,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
             ,0x453);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_40);
  if ((local_15 & 1) == 0) {
    local_70 = (Recycler *)
               Memory::_RecyclerAllocatorFunc<Memory::_RecyclerWriteBarrierPolicy>::GetAllocFunc();
    local_68 = extraout_RDX_00;
  }
  else {
    local_70 = (Recycler *)
               Memory::_RecyclerAllocatorFunc<Memory::_RecyclerWriteBarrierPolicy>::GetAllocZeroFunc
                         ();
    local_68 = extraout_RDX;
  }
  pSVar2 = Memory::
           AllocateArray<Memory::Recycler,JsUtil::SimpleDictionaryEntry<unsigned_int,Js::IndexPropertyDescriptor>,false>
                     ((Memory *)pRVar1,local_70,local_68,(long)local_14);
  return pSVar2;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }